

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O3

void edition_unittest::TestNestedExtension_OptionalGroup_extension::MergeImpl
               (MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  ulong uVar2;
  
  if (from_msg == to_msg) {
    MergeImpl();
  }
  uVar1 = *(uint *)&from_msg[1]._vptr_MessageLite;
  if ((uVar1 & 1) != 0) {
    *(int *)&to_msg[1]._internal_metadata_.ptr_ = (int)from_msg[1]._internal_metadata_.ptr_;
  }
  *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | uVar1;
  uVar2 = (from_msg->_internal_metadata_).ptr_;
  if ((uVar2 & 1) == 0) {
    return;
  }
  google::protobuf::internal::InternalMetadata::DoMergeFrom<google::protobuf::UnknownFieldSet>
            (&to_msg->_internal_metadata_,(UnknownFieldSet *)((uVar2 & 0xfffffffffffffffe) + 8));
  return;
}

Assistant:

void TestNestedExtension_OptionalGroup_extension::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<TestNestedExtension_OptionalGroup_extension*>(&to_msg);
  auto& from = static_cast<const TestNestedExtension_OptionalGroup_extension&>(from_msg);
  // @@protoc_insertion_point(class_specific_merge_from_start:edition_unittest.TestNestedExtension.OptionalGroup_extension)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000001u) != 0) {
    _this->_impl_.a_ = from._impl_.a_;
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}